

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

AddressFormatData *
cfd::core::Address::GetTargetFormatData
          (AddressFormatData *__return_storage_ptr__,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters,NetType_conflict type)

{
  NetType_conflict NVar1;
  bool bVar2;
  NetType_conflict NVar3;
  CfdException *pCVar4;
  allocator local_99;
  string local_98;
  AddressFormatData *local_78;
  AddressFormatData *param;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__range2;
  allocator local_41;
  string local_40;
  NetType_conflict local_1c;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *pvStack_18;
  NetType_conflict type_local;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters_local;
  
  local_1c = type;
  pvStack_18 = network_parameters;
  network_parameters_local =
       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
       __return_storage_ptr__;
  if (type == kCfdConnectionError) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_40,"CustomChain is not supported for address format list.",&local_41
              );
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_40);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  __end2 = ::std::
           vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
           begin(network_parameters);
  param = (AddressFormatData *)
          ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ::end(network_parameters);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                                *)&param);
    if (!bVar2) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_98,"target address format unknown error.",&local_99);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_98);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_78 = __gnu_cxx::
               __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
               ::operator*(&__end2);
    NVar1 = local_1c;
    NVar3 = AddressFormatData::GetNetType(local_78);
    if (NVar1 == NVar3) break;
    __gnu_cxx::
    __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
    ::operator++(&__end2);
  }
  AddressFormatData::AddressFormatData(__return_storage_ptr__,local_78);
  return __return_storage_ptr__;
}

Assistant:

AddressFormatData Address::GetTargetFormatData(
    const std::vector<AddressFormatData>& network_parameters, NetType type) {
  if (type == NetType::kCustomChain) {
    throw CfdException(
        kCfdIllegalArgumentError,
        "CustomChain is not supported for address format list.");
  }
  for (const auto& param : network_parameters) {
    if (type == param.GetNetType()) {
      return param;
    }
  }
  throw CfdException(
      kCfdIllegalArgumentError, "target address format unknown error.");
}